

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O0

void __thiscall
test::syntax_tests::iu_SyntaxTest_x_iutest_x_Near_Test::Body
          (iu_SyntaxTest_x_iutest_x_Near_Test *this)

{
  bool bVar1;
  Fixed *pFVar2;
  char *pcVar3;
  int *in_stack_fffffffffffff780;
  AssertionHelper local_7e0;
  Fixed local_7b0;
  int local_628;
  char local_624 [4];
  undefined1 local_620 [8];
  AssertionResult iutest_ar_3;
  undefined1 local_5f0 [4];
  int x_3;
  Fixed local_5c0;
  int local_438;
  char local_434 [4];
  undefined1 local_430 [8];
  AssertionResult iutest_ar_2;
  undefined1 local_400 [4];
  int x_2;
  Fixed local_3d0;
  int local_248;
  char local_244 [4];
  undefined1 local_240 [8];
  AssertionResult iutest_ar_1;
  int x_1;
  Fixed local_1e0;
  int local_48;
  char local_44 [4];
  undefined1 local_40 [8];
  AssertionResult iutest_ar;
  int x;
  iu_SyntaxTest_x_iutest_x_Near_Test *this_local;
  
  iutest_ar._36_4_ = 1;
  iutest::detail::AlwaysZero();
  local_44[0] = '\0';
  local_44[1] = '\0';
  local_44[2] = '\0';
  local_44[3] = '\0';
  local_48 = 2;
  iutest::internal::CmpHelperNear<int,int>
            ((AssertionResult *)local_40,(internal *)0x54fafc,"x","2",local_44,
             (int *)&iutest_ar.field_0x24,&local_48,in_stack_fffffffffffff780);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    memset(&local_1e0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1e0);
    pFVar2 = iutest::AssertionHelper::Fixed::operator<<(&local_1e0,iutest_ar._36_4_);
    pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_40);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&x_1,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
               ,0x118,pcVar3,kFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&x_1,pFVar2);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&x_1);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1e0);
  }
  iutest_ar_1._37_3_ = 0;
  iutest_ar_1._36_1_ = !bVar1;
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  if (iutest_ar_1._36_4_ == 0) {
    iutest_ar_1.m_result = true;
    iutest_ar_1._33_3_ = 0;
    iutest::detail::AlwaysZero();
    local_244[0] = '\0';
    local_244[1] = '\0';
    local_244[2] = '\0';
    local_244[3] = '\0';
    local_248 = 2;
    iutest::internal::CmpHelperNear<int,int>
              ((AssertionResult *)local_240,(internal *)0x54fafc,"x","2",local_244,
               (int *)&iutest_ar_1.m_result,&local_248,in_stack_fffffffffffff780);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
    if (!bVar1) {
      memset(&local_3d0,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_3d0);
      pFVar2 = iutest::AssertionHelper::Fixed::operator<<(&local_3d0,iutest_ar_1._32_4_);
      pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_240);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)local_400,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
                 ,0x11a,pcVar3,kNonFatalFailure);
      iutest::AssertionHelper::operator=((AssertionHelper *)local_400,pFVar2);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)local_400);
      iutest::AssertionHelper::Fixed::~Fixed(&local_3d0);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_240);
    iutest_ar_2._36_4_ = 1;
    iutest::detail::AlwaysZero();
    local_434[0] = '\0';
    local_434[1] = '\0';
    local_434[2] = '\0';
    local_434[3] = '\0';
    local_438 = 2;
    iutest::internal::CmpHelperNear<int,int>
              ((AssertionResult *)local_430,(internal *)0x54fafc,"x","2",local_434,
               (int *)&iutest_ar_2.field_0x24,&local_438,in_stack_fffffffffffff780);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_430);
    if (!bVar1) {
      memset(&local_5c0,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_5c0);
      pFVar2 = iutest::AssertionHelper::Fixed::operator<<(&local_5c0,iutest_ar_2._36_4_);
      pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_430);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)local_5f0,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
                 ,0x11c,pcVar3,kWarning);
      iutest::AssertionHelper::operator=((AssertionHelper *)local_5f0,pFVar2);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)local_5f0);
      iutest::AssertionHelper::Fixed::~Fixed(&local_5c0);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_430);
    iutest_ar_3._36_4_ = 1;
    iutest::detail::AlwaysZero();
    local_624[0] = '\0';
    local_624[1] = '\0';
    local_624[2] = '\0';
    local_624[3] = '\0';
    local_628 = 2;
    iutest::internal::CmpHelperNear<int,int>
              ((AssertionResult *)local_620,(internal *)0x54fafc,"x","2",local_624,
               (int *)&iutest_ar_3.field_0x24,&local_628,in_stack_fffffffffffff780);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_620);
    if (!bVar1) {
      memset(&local_7b0,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_7b0);
      pFVar2 = iutest::AssertionHelper::Fixed::operator<<(&local_7b0,iutest_ar_3._36_4_);
      pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_620);
      iutest::AssertionHelper::AssertionHelper
                (&local_7e0,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
                 ,0x11e,pcVar3,kAssumeFailure);
      iutest::AssertionHelper::operator=(&local_7e0,pFVar2);
      iutest::AssertionHelper::~AssertionHelper(&local_7e0);
      iutest::AssertionHelper::Fixed::~Fixed(&local_7b0);
    }
    iutest_ar_1._37_3_ = 0;
    iutest_ar_1._36_1_ = !bVar1;
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_620);
  }
  return;
}

Assistant:

IUTEST(SyntaxTest, Near)
{
    if( int x = 1 )
        IUTEST_ASSERT_NEAR(0, x, 2) << x;
    if( int x = 1 )
        IUTEST_EXPECT_NEAR(0, x, 2) << x;
    if( int x = 1 )
        IUTEST_INFORM_NEAR(0, x, 2) << x;
    if( int x = 1 )
        IUTEST_ASSUME_NEAR(0, x, 2) << x;
}